

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AllocatedSizeAtCapacity
          (RepeatedPtrFieldBase *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  LogMessage *pLVar4;
  Rep *pRVar5;
  undefined1 auVar6 [16];
  bool local_81;
  LogMessageFatal local_60 [23];
  Voidify local_49;
  string *local_48;
  string *absl_log_internal_check_op_result_1;
  undefined8 local_38;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  string *local_18;
  string *absl_log_internal_check_op_result;
  RepeatedPtrFieldBase *this_local;
  
  absl_log_internal_check_op_result = (string *)this;
  iVar2 = size(this);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar2);
  iVar3 = allocated_size(this);
  iVar3 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar3);
  local_18 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (iVar2,iVar3,"size() <= allocated_size()");
  if (local_18 != (string *)0x0) {
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_18);
    local_38 = auVar6._8_8_;
    absl_log_internal_check_op_result_1 = auVar6._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0x269,absl_log_internal_check_op_result_1,local_38);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
  }
  iVar2 = allocated_size(this);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar2);
  iVar3 = Capacity(this);
  iVar3 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar3);
  local_48 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (iVar2,iVar3,"allocated_size() <= Capacity()");
  if (local_48 != (string *)0x0) {
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0x26a,auVar6._0_8_,auVar6._8_8_);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_60);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_49,pLVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_60);
  }
  bVar1 = using_sso(this);
  if (bVar1) {
    local_81 = this->tagged_rep_or_elem_ != (void *)0x0;
  }
  else {
    pRVar5 = rep(this);
    iVar2 = pRVar5->allocated_size;
    iVar3 = Capacity(this);
    local_81 = iVar3 <= iVar2;
  }
  return local_81;
}

Assistant:

inline bool AllocatedSizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This combines optimization mentioned in `SizeAtCapacity()` and simplifies
    // `allocated_size()` in sso case.
    return using_sso() ? (tagged_rep_or_elem_ != nullptr)
                       : rep()->allocated_size >= Capacity();
  }